

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::LoadBalanceLevel0(Amr *this,Real time)

{
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var1;
  undefined1 local_20 [16];
  
  makeLoadBalanceDistributionMap((Amr *)local_20,(int)this,time,(BoxArray *)0x0);
  InstallNewDistributionMap(this,0,(DistributionMapping *)local_20);
  _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (((this->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  (**(code **)(*(long *)_Var1.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x98))
            (_Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
  }
  return;
}

Assistant:

void
Amr::LoadBalanceLevel0 (Real time)
{
    BL_PROFILE("LoadBalanceLevel0()");
    const auto& dm = makeLoadBalanceDistributionMap(0, time, boxArray(0));
    InstallNewDistributionMap(0, dm);
    amr_level[0]->post_regrid(0,0);
}